

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

void __thiscall
TypeStruct::setFields(TypeStruct *this,vector<TypeField,_std::allocator<TypeField>_> *fd)

{
  int iVar1;
  pointer __x;
  
  (this->super_Datatype).size = 0;
  for (__x = (fd->super__Vector_base<TypeField,_std::allocator<TypeField>_>)._M_impl.
             super__Vector_impl_data._M_start;
      __x != (fd->super__Vector_base<TypeField,_std::allocator<TypeField>_>)._M_impl.
             super__Vector_impl_data._M_finish; __x = __x + 1) {
    std::vector<TypeField,_std::allocator<TypeField>_>::push_back(&this->field,__x);
    iVar1 = __x->type->size + __x->offset;
    if ((this->super_Datatype).size < iVar1) {
      (this->super_Datatype).size = iVar1;
    }
  }
  return;
}

Assistant:

void TypeStruct::setFields(const vector<TypeField> &fd)

{
  vector<TypeField>::const_iterator iter;
  int4 end;
				// Need to calculate size
  size = 0;
  for(iter=fd.begin();iter!=fd.end();++iter) {
    field.push_back(*iter);
    end = (*iter).offset + (*iter).type->getSize();
    if (end > size)
      size = end;
  }
}